

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
ValidatorTest_ReturnUnreachable_Test::~ValidatorTest_ReturnUnreachable_Test
          (ValidatorTest_ReturnUnreachable_Test *this)

{
  ValidatorTest_ReturnUnreachable_Test *this_local;
  
  ~ValidatorTest_ReturnUnreachable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ValidatorTest, ReturnUnreachable) {
  Module module;
  Builder builder(module);

  // (return (unreachable)) should be invalid if a function has no return type.
  auto func =
    builder.makeFunction("func",
                         {},
                         Signature(Type::none, Type::none),
                         {},
                         builder.makeReturn(builder.makeUnreachable()));

  auto flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(WasmValidator{}.validate(func.get(), module, flags));
}